

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::pattern_formatter::format(pattern_formatter *this,log_msg *msg,memory_buf_t *dest)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  char *begin;
  long lVar3;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *f;
  pointer puVar4;
  tm local_68;
  
  if (this->need_localtime_ == true) {
    lVar3 = (msg->time).__d.__r / 1000000000;
    if (lVar3 != (this->last_log_secs_).__r) {
      get_time_(&local_68,this,msg);
      (this->cached_tm_).tm_zone = local_68.tm_zone;
      (this->cached_tm_).tm_isdst = local_68.tm_isdst;
      *(undefined4 *)&(this->cached_tm_).field_0x24 = local_68._36_4_;
      (this->cached_tm_).tm_gmtoff = local_68.tm_gmtoff;
      (this->cached_tm_).tm_mon = local_68.tm_mon;
      (this->cached_tm_).tm_year = local_68.tm_year;
      (this->cached_tm_).tm_wday = local_68.tm_wday;
      (this->cached_tm_).tm_yday = local_68.tm_yday;
      (this->cached_tm_).tm_sec = local_68.tm_sec;
      (this->cached_tm_).tm_min = local_68.tm_min;
      (this->cached_tm_).tm_hour = local_68.tm_hour;
      (this->cached_tm_).tm_mday = local_68.tm_mday;
      (this->last_log_secs_).__r = lVar3;
    }
  }
  puVar4 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      pfVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      (*pfVar2->_vptr_flag_formatter[2])(pfVar2,msg,&this->cached_tm_,dest);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  begin = (this->eol_)._M_dataplus._M_p;
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,begin,begin + (this->eol_)._M_string_length);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::format(const details::log_msg &msg, memory_buf_t &dest)
{
    if (need_localtime_)
    {
        const auto secs = std::chrono::duration_cast<std::chrono::seconds>(msg.time.time_since_epoch());
        if (secs != last_log_secs_)
        {
            cached_tm_ = get_time_(msg);
            last_log_secs_ = secs;
        }
    }

    for (auto &f : formatters_)
    {
        f->format(msg, cached_tm_, dest);
    }
    // write eol
    details::fmt_helper::append_string_view(eol_, dest);
}